

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# repeated_field.h
# Opt level: O2

pointer __thiscall
google::protobuf::RepeatedField<bool>::Mutable(RepeatedField<bool> *this,int index)

{
  int v2;
  string *psVar1;
  bool *pbVar2;
  size_type sVar3;
  undefined8 uVar4;
  pointer pcVar5;
  LogMessageFatal local_20 [16];
  
  psVar1 = absl::lts_20240722::log_internal::Check_GEImpl_abi_cxx11_(index,0,"index >= 0");
  if (psVar1 == (string *)0x0) {
    v2 = size(this);
    psVar1 = absl::lts_20240722::log_internal::Check_LTImpl_abi_cxx11_(index,v2,"index < size()");
    if (psVar1 == (string *)0x0) {
      pbVar2 = elements(this,(undefined1  [16])
                             ((undefined1  [16])(this->soo_rep_).field_0 & (undefined1  [16])0x4) ==
                             (undefined1  [16])0x0);
      return pbVar2 + index;
    }
    pcVar5 = (psVar1->_M_dataplus)._M_p;
    sVar3 = psVar1->_M_string_length;
    uVar4 = 0x33f;
  }
  else {
    pcVar5 = (psVar1->_M_dataplus)._M_p;
    sVar3 = psVar1->_M_string_length;
    uVar4 = 0x33e;
  }
  absl::lts_20240722::log_internal::LogMessageFatal::LogMessageFatal
            (local_20,
             "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O2/_deps/protobuf-src/src/google/protobuf/repeated_field.h"
             ,uVar4,sVar3,pcVar5);
  absl::lts_20240722::log_internal::LogMessageFatal::~LogMessageFatal(local_20);
}

Assistant:

inline Element* RepeatedField<Element>::Mutable(int index)
    ABSL_ATTRIBUTE_LIFETIME_BOUND {
  ABSL_DCHECK_GE(index, 0);
  ABSL_DCHECK_LT(index, size());
  return &elements(is_soo())[index];
}